

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  SudokuGitter SStack_f8;
  SudokuGitter gitter;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_a8;
  tuple<SudokuGitter,_SudokuGitter> bigGitter;
  
  mainClassicSudoku(&gitter,9);
  SudokuGitter::SudokuGitter(&SStack_f8,&gitter);
  visualizeClassicSudoku(&SStack_f8);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&SStack_f8.cells);
  mainBigSudoku(&bigGitter,9);
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::_Tuple_impl
            (&local_a8,&bigGitter.super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>);
  visualizeBigSudoku((tuple<SudokuGitter,_SudokuGitter> *)&local_a8);
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::~_Tuple_impl(&local_a8);
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::~_Tuple_impl
            (&bigGitter.super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&gitter.cells);
  return 0;
}

Assistant:

int main() {
    int elements = 9;
    SudokuGitter gitter = mainClassicSudoku(elements);
    visualizeClassicSudoku(gitter);

    tuple<SudokuGitter, SudokuGitter> bigGitter = mainBigSudoku(elements);
    visualizeBigSudoku(bigGitter);
}